

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O1

bool __thiscall kws::Generator::CreateHeader(Generator *this,ostream *file,char *title)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  _Alloc_hider _Var3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  string tit;
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(file,"<html>",6);
  cVar2 = (char)file;
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"<head>",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file," <meta name=\"description\" content=\"kitware.com\" />",0x32);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file," <meta name=\"keywords\" content=\"kwstyle,Kitware,Style,Checker,Dart\" />",0x46)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file," <meta name=\"author\" content=\"Kitware\" />",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file," <meta name=\"revisit-after\" content=\"2 days\" />",0x2f);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file," <meta name=\"robots\" content=\"all\" />",0x25);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file," <title>KWStyle - ",0x12);
  if (title == (char *)0x0) {
    std::ios::clear((int)file + (int)*(undefined8 *)(*(long *)file + -0x18));
  }
  else {
    sVar4 = strlen(title);
    std::__ostream_insert<char,std::char_traits<char>>(file,title,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(file,"</title>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"</head>",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"<table width=\"100%\" border=\"0\">",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file," <tr>",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"   <td width=\"15%\" height=\"2\"><img src=\"images/",0x2f);
  std::__cxx11::string::string((string *)&local_40,(this->m_ProjectLogo)._M_dataplus._M_p,&local_61)
  ;
  kwssys::SystemTools::GetFilenameName(&local_60,&local_40);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (file,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"></td>",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"   <td width=\"85%\" height=\"2\" bgcolor=\"#0099CC\"> ",0x31);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__cxx11::string::string((string *)&local_60,title,(allocator *)&local_40);
  lVar6 = std::__cxx11::string::find_last_of((char *)&local_60,0x179451,0xffffffffffffffff);
  if (lVar6 != -1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)&local_60);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  lVar6 = std::__cxx11::string::find_last_of((char *)&local_60,0x16b541,0xffffffffffffffff);
  if (lVar6 != -1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)&local_60);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"     <div align=\"left\"><b><font color=\"#FFFFFF\" size=\"5\">KWStyle - ",0x43);
  _Var3._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)file + (int)*(undefined8 *)(*(long *)file + -0x18));
  }
  else {
    sVar4 = strlen(local_60._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(file,_Var3._M_p,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(file,"</font></b></div>",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"   </td>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file," </tr>",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"</table>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"<table width=\"100%\" border=\"0\">",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file," <tr> ",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"   <td width=\"15%\" height=\"30\" >&nbsp;</td>",0x2b);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"   <td height=\"30\" width=\"12%\" bgcolor=\"#0099CC\"> ",0x32);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"     <div align=\"center\"><a href=\"KWSMatrix.html\">Matrix View</a></div>",0x47
            );
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"   </td>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"   <td width=\"10%\" height=\"30\" bgcolor=\"#0099CC\" >",0x32);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file," <div align=\"center\"><a href=\"KWSDescription.html\">Description</a></div>",
             0x48);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"  </td>",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"   <td width=\"63%\" height=\"30\"> ",0x20);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (file,"     <div align=\"left\"><b></b></div>",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"     <div align=\"right\"></div>",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"   </td>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file," </tr>",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"</table>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(file,"<hr size=\"1\">",0xd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool Generator::CreateHeader(std::ostream * file,const char* title)
{
  *file << "<html>" << std::endl;
  *file << "<head>" << std::endl;
  *file << R"( <meta name="description" content="kitware.com" />)" << std::endl;
  *file
      << R"( <meta name="keywords" content="kwstyle,Kitware,Style,Checker,Dart" />)"
      << std::endl;
  *file << R"( <meta name="author" content="Kitware" />)" << std::endl;
  *file << R"( <meta name="revisit-after" content="2 days" />)" << std::endl;
  *file << R"( <meta name="robots" content="all" />)" << std::endl;
  *file << " <title>KWStyle - " << title << "</title>" << std::endl;
  *file << "</head>" << std::endl;

  // Now create the top frame
  *file << R"(<table width="100%" border="0">)" << std::endl;
  *file << " <tr>" << std::endl;
  *file << R"(   <td width="15%" height="2"><img src="images/)"
        << kwssys::SystemTools::GetFilenameName(m_ProjectLogo.c_str())
        << "\"></td>" << std::endl;
  *file << R"(   <td width="85%" height="2" bgcolor="#0099CC"> )" << std::endl;

  // remove the last extension
  std::string tit = title;
  auto pos = static_cast<long int>(tit.find_last_of("."));
  if (pos != -1) {
    tit = tit.substr(0, pos);
   }
 pos = static_cast<long int>(tit.find_last_of("/"));
 if(pos!=-1)
   {
   tit = tit.substr(pos+1,tit.size()-pos-1);
   }

   *file
       << R"(     <div align="left"><b><font color="#FFFFFF" size="5">KWStyle - )"
       << tit.c_str() << "</font></b></div>" << std::endl;
   *file << "   </td>" << std::endl;
   *file << " </tr>" << std::endl;
   *file << "</table>" << std::endl;
   *file << R"(<table width="100%" border="0">)" << std::endl;
   *file << " <tr> " << std::endl;
   *file << R"(   <td width="15%" height="30" >&nbsp;</td>)" << std::endl;
   *file << R"(   <td height="30" width="12%" bgcolor="#0099CC"> )"
         << std::endl;
   *file
       << R"(     <div align="center"><a href="KWSMatrix.html">Matrix View</a></div>)"
       << std::endl;
   *file << "   </td>" << std::endl;
   *file << R"(   <td width="10%" height="30" bgcolor="#0099CC" >)"
         << std::endl;
   *file
       << R"( <div align="center"><a href="KWSDescription.html">Description</a></div>)"
       << std::endl;
   *file << "  </td>" << std::endl;
   *file << R"(   <td width="63%" height="30"> )" << std::endl;
   *file << "     <div align=\"left\"><b></b></div>" << std::endl;
   *file << "     <div align=\"right\"></div>" << std::endl;
   *file << "   </td>" << std::endl;
   *file << " </tr>" << std::endl;
   *file << "</table>" << std::endl;
   *file << "<hr size=\"1\">";
   return true;
}